

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkCreateLevels_(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Wlc_Obj_t *p_01;
  int in_EDX;
  int i;
  int iVar2;
  int Entry;
  int Id;
  
  p_00 = &p->vLevels;
  Vec_IntFill(p_00,p->iObj,in_EDX);
  iVar2 = 0;
  for (Id = 1; Id < p->iObj; Id = Id + 1) {
    p_01 = Wlc_NtkObj(p,Id);
    Entry = 0;
    for (i = 0; i < (int)p_01->nFanins; i = i + 1) {
      iVar1 = Wlc_ObjFaninId(p_01,i);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (Entry <= iVar1 + 1) {
        Entry = iVar1 + 1;
      }
    }
    Vec_IntWriteEntry(p_00,Id,Entry);
    if (iVar2 <= Entry) {
      iVar2 = Entry;
    }
  }
  return iVar2;
}

Assistant:

int Wlc_NtkCreateLevels_( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Level = 0;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Level = Abc_MaxInt( Level, Wlc_ObjLevelId(p, iFanin) + 1 );
        Vec_IntWriteEntry( &p->vLevels, i, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}